

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uprops.cpp
# Opt level: O0

int32_t getHangulSyllableType(IntProperty *param_1,UChar32 c,UProperty param_3)

{
  uint32_t uVar1;
  uint uVar2;
  int32_t gcb;
  UProperty param_2_local;
  UChar32 c_local;
  IntProperty *param_0_local;
  
  uVar1 = u_getUnicodeProperties_63(c,2);
  uVar2 = (int)(uVar1 & 0x3e0) >> 5;
  if (uVar2 < 10) {
    param_0_local._4_4_ = gcbToHst[(int)uVar2];
  }
  else {
    param_0_local._4_4_ = U_HST_NOT_APPLICABLE;
  }
  return param_0_local._4_4_;
}

Assistant:

static int32_t getHangulSyllableType(const IntProperty &/*prop*/, UChar32 c, UProperty /*which*/) {
    /* see comments on gcbToHst[] above */
    int32_t gcb=(int32_t)(u_getUnicodeProperties(c, 2)&UPROPS_GCB_MASK)>>UPROPS_GCB_SHIFT;
    if(gcb<UPRV_LENGTHOF(gcbToHst)) {
        return gcbToHst[gcb];
    } else {
        return U_HST_NOT_APPLICABLE;
    }
}